

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

size_t gpu::deviceTypeSize<double>(void)

{
  Type TVar1;
  gpu_exception *this;
  Context context;
  Context local_20;
  
  Context::Context(&local_20);
  TVar1 = Context::type(&local_20);
  if (TVar1 == TypeOpenCL) {
    if (local_20.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.data_ref_.
                 super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return 8;
  }
  this = (gpu_exception *)__cxa_allocate_exception(0x10);
  gpu_exception::gpu_exception(this,"No GPU active context!");
  __cxa_throw(this,&gpu_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t gpu::deviceTypeSize() {
	Context context;
#ifdef CUDA_SUPPORT
	if (context.type() == Context::TypeCUDA) {
		return sizeof(T);
	} else
#endif
	if (context.type() == Context::TypeOpenCL) {
		return sizeof(typename ocl::OpenCLType<T>::type);
	} else {
		throw gpu_exception("No GPU active context!");
	}
}